

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.h
# Opt level: O0

Element __thiscall Galois::Element::operator*(Element *this,Element *rhs)

{
  Field *in_RDX;
  undefined8 extraout_RDX;
  Element *in_RSI;
  Field *in_RDI;
  Element EVar1;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  Array2d<int>::operator()
            ((Array2d<int> *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  Element(in_RSI,in_RDX,(int)((ulong)in_RDI >> 0x20));
  EVar1._8_8_ = extraout_RDX;
  EVar1.m_gf = in_RDI;
  return EVar1;
}

Assistant:

Element operator*(const Element& rhs) const
    {
#ifdef GF_SIZE_DEBUG
        if (m_gf->q != rhs.m_gf->q)
            throw std::runtime_error("incompatible fields");
#endif
#ifdef GF_RANGE_DEBUG
        return Element(m_gf, m_gf->times.at(m_value, rhs.m_value));
#else
        return Element(m_gf, m_gf->times(m_value, rhs.m_value));
#endif
    }